

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

SetExprBinsSelectExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SetExprBinsSelectExpr,slang::ast::Expression_const&,slang::ast::Expression_const*&>
          (BumpAllocator *this,Expression *args,Expression **args_1)

{
  Expression *pEVar1;
  SetExprBinsSelectExpr *pSVar2;
  
  pSVar2 = (SetExprBinsSelectExpr *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SetExprBinsSelectExpr *)this->endPtr < pSVar2 + 1) {
    pSVar2 = (SetExprBinsSelectExpr *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pSVar2 + 1);
  }
  pEVar1 = *args_1;
  (pSVar2->super_BinsSelectExpr).kind = SetExpr;
  (pSVar2->super_BinsSelectExpr).syntax = (SyntaxNode *)0x0;
  pSVar2->expr = args;
  pSVar2->matchesExpr = pEVar1;
  return pSVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }